

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

int __thiscall
MeCab::anon_unknown_0::TaggerImpl::open(TaggerImpl *this,char *__file,int __oflag,...)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  double dVar4;
  TaggerImpl *this_00;
  TaggerImpl *pTVar3;
  
  this_00 = this;
  bVar1 = ModelImpl::is_available((ModelImpl *)this);
  pTVar3 = (TaggerImpl *)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    scoped_ptr<MeCab::(anonymous_namespace)::ModelImpl>::reset
              ((scoped_ptr<MeCab::(anonymous_namespace)::ModelImpl> *)this_00,(ModelImpl *)__file);
    this->current_model_ = (ModelImpl *)__file;
    iVar2 = ModelImpl::request_type(this->current_model_);
    this->request_type_ = iVar2;
    pTVar3 = this;
    dVar4 = ModelImpl::theta(this->current_model_);
    pTVar3->theta_ = dVar4;
  }
  return (int)CONCAT71((int7)((ulong)pTVar3 >> 8),bVar1);
}

Assistant:

bool TaggerImpl::open(const ModelImpl &model) {
  if (!model.is_available()) {
    return false;
  }
  model_.reset(0);
  current_model_ = &model;
  request_type_ = current_model_->request_type();
  theta_        = current_model_->theta();
  return true;
}